

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry_sparse.c
# Opt level: O0

void archive_entry_sparse_add_entry(archive_entry *entry,la_int64_t offset,la_int64_t length)

{
  la_int64_t lVar1;
  ae_sparse *paVar2;
  ae_sparse *sp;
  la_int64_t length_local;
  la_int64_t offset_local;
  archive_entry *entry_local;
  
  if (offset < 0) {
    return;
  }
  if (length < 0) {
    return;
  }
  if (0x7fffffffffffffff - length < offset) {
    return;
  }
  lVar1 = archive_entry_size(entry);
  if (offset + length <= lVar1) {
    paVar2 = entry->sparse_tail;
    if (paVar2 != (ae_sparse *)0x0) {
      if (offset < paVar2->offset + paVar2->length) {
        return;
      }
      if (paVar2->offset + paVar2->length == offset) {
        if (paVar2->offset + paVar2->length + length < 0) {
          return;
        }
        paVar2->length = length + paVar2->length;
        return;
      }
    }
    paVar2 = (ae_sparse *)malloc(0x18);
    if (paVar2 != (ae_sparse *)0x0) {
      paVar2->offset = offset;
      paVar2->length = length;
      paVar2->next = (ae_sparse *)0x0;
      if (entry->sparse_head == (ae_sparse *)0x0) {
        entry->sparse_tail = paVar2;
        entry->sparse_head = paVar2;
      }
      else {
        if (entry->sparse_tail != (ae_sparse *)0x0) {
          entry->sparse_tail->next = paVar2;
        }
        entry->sparse_tail = paVar2;
      }
    }
    return;
  }
  return;
}

Assistant:

void
archive_entry_sparse_add_entry(struct archive_entry *entry,
	la_int64_t offset, la_int64_t length)
{
	struct ae_sparse *sp;

	if (offset < 0 || length < 0)
		/* Invalid value */
		return;
	if (offset > INT64_MAX - length ||
	    offset + length > archive_entry_size(entry))
		/* A value of "length" parameter is too large. */
		return;
	if ((sp = entry->sparse_tail) != NULL) {
		if (sp->offset + sp->length > offset)
			/* Invalid value. */
			return;
		if (sp->offset + sp->length == offset) {
			if (sp->offset + sp->length + length < 0)
				/* A value of "length" parameter is
				 * too large. */
				return;
			/* Expand existing sparse block size. */
			sp->length += length;
			return;
		}
	}

	if ((sp = (struct ae_sparse *)malloc(sizeof(*sp))) == NULL)
		/* XXX Error XXX */
		return;

	sp->offset = offset;
	sp->length = length;
	sp->next = NULL;

	if (entry->sparse_head == NULL)
		entry->sparse_head = entry->sparse_tail = sp;
	else {
		/* Add a new sparse block to the tail of list. */
		if (entry->sparse_tail != NULL)
			entry->sparse_tail->next = sp;
		entry->sparse_tail = sp;
	}
}